

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Diligent::ShaderVkImpl::GetSPIRV(ShaderVkImpl *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  
  if (GetSPIRV()::NullSPIRV == '\0') {
    GetSPIRV();
  }
  pvVar1 = &GetSPIRV::NullSPIRV;
  if (SHADER_STATUS_COMPILING < (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i
     ) {
    pvVar1 = &this->m_SPIRV;
  }
  return pvVar1;
}

Assistant:

GetSPIRV() const override final
    {
        static const std::vector<uint32_t> NullSPIRV;
        // NOTE: while shader is compiled asynchronously, m_SPIRV may be modified by
        //       another thread and thus can't be accessed.
        return !IsCompiling() ? m_SPIRV : NullSPIRV;
    }